

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general_attr.cpp
# Opt level: O3

void testAttrOpaque(string *tempdir)

{
  int iVar1;
  exr_result_t eVar2;
  exr_context_t ctxt;
  ostream *poVar3;
  char *pcVar4;
  size_t sVar5;
  char *in_RCX;
  char *pcVar6;
  _internal_exr_context *pctxt;
  uint8_t data4 [4];
  exr_context_t f;
  uint local_9c;
  exr_attr_opaquedata_t local_98;
  exr_attr_opaquedata_t local_58;
  exr_context_t local_20;
  
  ctxt = createDummyFile("<opaque>");
  local_9c = 0xefbeadde;
  local_20 = ctxt;
  if (ctxt == (exr_context_t)0x0) {
    iVar1 = 2;
LAB_00126875:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n    expected: (",0x10);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    core_test_fail("exr_attr_opaquedata_init (f, __null, 4)",(char *)0x359,0x17e31f,in_RCX);
  }
  iVar1 = (**(code **)(ctxt + 0x40))(ctxt,3,"Invalid reference to opaque data object to initialize")
  ;
  if (iVar1 != 3) goto LAB_00126875;
  pcVar6 = (char *)0x80000000;
  iVar1 = (**(code **)(ctxt + 0x48))
                    (ctxt,3,"Invalid size for opaque data (%lu bytes, must be <= INT32_MAX)");
  if (iVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar4,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n    expected: (",0x10);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
    pcVar4 = (char *)exr_get_default_error_message(3);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar4,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    core_test_fail("exr_attr_opaquedata_init (f, &o, (size_t) (2147483647) + 1)",(char *)0x35c,
                   0x17e31f,pcVar6);
  }
  s_malloc_fail_on = 1;
  local_98.size = 0;
  local_98.unpacked_size = 0;
  local_98.packed_alloc_size = 0;
  local_98.pad[0] = '\0';
  local_98.pad[1] = '\0';
  local_98.pad[2] = '\0';
  local_98.pad[3] = '\0';
  local_98.packed_data = (void *)0x0;
  local_98.unpacked_data = (void *)0x0;
  local_98.unpack_func_ptr =
       (_func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr_ptr *)0x0;
  local_98.pack_func_ptr =
       (_func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr *)0x0;
  local_98.destroy_unpacked_func_ptr = (_func_void_exr_context_t_void_ptr_int32_t *)0x0;
  local_98.packed_data = (void *)(**(code **)(ctxt + 0x58))(4);
  if (local_98.packed_data != (void *)0x0) {
    local_98.size = 4;
    local_98.packed_alloc_size = 4;
    iVar1 = 0;
LAB_00126a34:
    s_malloc_fail_on = 0;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar4,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n    expected: (",0x10);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
    pcVar4 = (char *)exr_get_default_error_message(1);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar4,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    core_test_fail("exr_attr_opaquedata_init (f, &o, 4)",(char *)0x35e,0x17e31f,pcVar6);
  }
  iVar1 = (**(code **)(ctxt + 0x38))(ctxt,1);
  s_malloc_fail_on = 0;
  if (iVar1 != 1) goto LAB_00126a34;
  pcVar6 = (char *)0xffffffff;
  iVar1 = (**(code **)(ctxt + 0x48))
                    (ctxt,3,"Invalid size for opaque data (%lu bytes, must be <= INT32_MAX)");
  if (iVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar4,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n    expected: (",0x10);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
    pcVar4 = (char *)exr_get_default_error_message(3);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar4,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    core_test_fail("exr_attr_opaquedata_init (f, &o, (uint32_t) -1)",(char *)0x366,0x17e31f,pcVar6);
  }
  pcVar6 = (char *)0xffffffffffffffff;
  iVar1 = (**(code **)(ctxt + 0x48))
                    (ctxt,3,"Invalid size for opaque data (%lu bytes, must be <= INT32_MAX)");
  if (iVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar4,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n    expected: (",0x10);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
    pcVar4 = (char *)exr_get_default_error_message(3);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar4,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    core_test_fail("exr_attr_opaquedata_init (f, &o, (size_t) -1)",(char *)0x369,0x17e31f,pcVar6);
  }
  local_98.unpack_func_ptr =
       (_func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr_ptr *)0x0;
  local_98.pack_func_ptr =
       (_func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr *)0x0;
  local_98.packed_data = (void *)0x0;
  local_98.unpacked_data = (void *)0x0;
  local_98.size = 0;
  local_98.unpacked_size = 0;
  local_98.packed_alloc_size = 0;
  local_98.pad[0] = '\0';
  local_98.pad[1] = '\0';
  local_98.pad[2] = '\0';
  local_98.pad[3] = '\0';
  local_98.destroy_unpacked_func_ptr = (_func_void_exr_context_t_void_ptr_int32_t *)0x0;
  local_98.packed_data = (void *)(**(code **)(ctxt + 0x58))(4);
  if (local_98.packed_data == (void *)0x0) {
    iVar1 = (**(code **)(ctxt + 0x38))(ctxt,1);
    if (iVar1 == 0) {
      core_test_fail("o.size == 4",(char *)0x36c,0x17e31f,pcVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar4,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    core_test_fail("exr_attr_opaquedata_init (f, &o, 4)",(char *)0x36b,0x17e31f,pcVar6);
  }
  (**(code **)(ctxt + 0x60))(local_98.packed_data);
  local_98.unpack_func_ptr =
       (_func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr_ptr *)0x0;
  local_98.pack_func_ptr =
       (_func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr *)0x0;
  local_98.packed_data = (void *)0x0;
  local_98.unpacked_data = (void *)0x0;
  local_98.size = 0;
  local_98.unpacked_size = 0;
  local_98.packed_alloc_size = 0;
  local_98.pad[0] = '\0';
  local_98.pad[1] = '\0';
  local_98.pad[2] = '\0';
  local_98.pad[3] = '\0';
  local_98.destroy_unpacked_func_ptr = (_func_void_exr_context_t_void_ptr_int32_t *)0x0;
  local_98.packed_data = (void *)(**(code **)(ctxt + 0x58))(4);
  if ((uint *)local_98.packed_data == (uint *)0x0) {
    iVar1 = (**(code **)(ctxt + 0x38))(ctxt,1);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
      pcVar4 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar4 == (char *)0x0) {
        std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      }
      else {
        sVar5 = strlen(pcVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar4,sVar5);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      core_test_fail("exr_attr_opaquedata_create (f, &o, 4, data4)",(char *)0x374,0x17e31f,pcVar6);
    }
    core_test_fail("o.size == 4",(char *)0x375,0x17e31f,pcVar6);
  }
  pcVar6 = (char *)0x4;
  local_98.size = 4;
  local_98.packed_alloc_size = 4;
  *(uint *)local_98.packed_data = 0xefbeadde;
  if ((uint *)local_98.packed_data == (uint *)0x0) {
    core_test_fail("o.packed_data != __null",(char *)0x377,0x17e31f,(char *)0x4);
  }
  if (*local_98.packed_data != local_9c) {
    core_test_fail("0 == memcmp (o.packed_data, data4, 4)",(char *)0x378,0x17e31f,(char *)0x4);
  }
  eVar2 = exr_attr_opaquedata_copy(ctxt,(exr_attr_opaquedata_t *)0x0,&local_98);
  if (eVar2 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
    pcVar4 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar4,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n    expected: (",0x10);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
    pcVar4 = (char *)exr_get_default_error_message(3);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar4,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    core_test_fail("exr_attr_opaquedata_copy (f, __null, &o)",(char *)0x380,0x17e31f,pcVar6);
  }
  eVar2 = exr_attr_opaquedata_copy(ctxt,&local_58,&local_98);
  if (eVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
    pcVar4 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar4,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    core_test_fail("exr_attr_opaquedata_copy (f, &o2, &o)",(char *)0x381,0x17e31f,pcVar6);
  }
  if (local_58.size != 4) {
    core_test_fail("o2.size == 4",(char *)0x382,0x17e31f,pcVar6);
  }
  if (local_58.packed_alloc_size != 4) {
    core_test_fail("o2.packed_alloc_size == 4",(char *)0x383,0x17e31f,pcVar6);
  }
  if ((uint *)local_58.packed_data == (uint *)0x0) {
    core_test_fail("o2.packed_data != __null",(char *)0x384,0x17e31f,pcVar6);
  }
  if (*local_58.packed_data != local_9c) {
    core_test_fail("0 == memcmp (o2.packed_data, data4, 4)",(char *)0x385,0x17e31f,pcVar6);
  }
  (**(code **)(ctxt + 0x60))();
  if ((local_58.unpacked_data != (void *)0x0) &&
     (local_58.destroy_unpacked_func_ptr != (_func_void_exr_context_t_void_ptr_int32_t *)0x0)) {
    (*local_58.destroy_unpacked_func_ptr)(ctxt,local_58.unpacked_data,local_58.unpacked_size);
  }
  local_58.unpack_func_ptr =
       (_func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr_ptr *)0x0;
  local_58.pack_func_ptr =
       (_func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr *)0x0;
  local_58.packed_data = (void *)0x0;
  local_58.unpacked_data = (void *)0x0;
  local_58.size = 0;
  local_58.unpacked_size = 0;
  local_58.packed_alloc_size = 0;
  local_58.pad[0] = '\0';
  local_58.pad[1] = '\0';
  local_58.pad[2] = '\0';
  local_58.pad[3] = '\0';
  local_58.destroy_unpacked_func_ptr = (_func_void_exr_context_t_void_ptr_int32_t *)0x0;
  if (((uint *)local_98.packed_data != (uint *)0x0) && (0 < local_98.packed_alloc_size)) {
    (**(code **)(ctxt + 0x60))();
  }
  if ((local_98.unpacked_data != (void *)0x0) &&
     (local_98.destroy_unpacked_func_ptr != (_func_void_exr_context_t_void_ptr_int32_t *)0x0)) {
    (*local_98.destroy_unpacked_func_ptr)(ctxt,local_98.unpacked_data,local_98.unpacked_size);
  }
  local_98.unpack_func_ptr =
       (_func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr_ptr *)0x0;
  local_98.pack_func_ptr =
       (_func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr *)0x0;
  local_98.packed_data = (void *)0x0;
  local_98.unpacked_data = (void *)0x0;
  local_98.size = 0;
  local_98.unpacked_size = 0;
  local_98.packed_alloc_size = 0;
  local_98.pad[0] = '\0';
  local_98.pad[1] = '\0';
  local_98.pad[2] = '\0';
  local_98.pad[3] = '\0';
  local_98.destroy_unpacked_func_ptr = (_func_void_exr_context_t_void_ptr_int32_t *)0x0;
  iVar1 = (**(code **)(ctxt + 0x38))(ctxt,3);
  if (iVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar4,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n    expected: (",0x10);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
    pcVar4 = (char *)exr_get_default_error_message(3);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar4,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    core_test_fail("exr_attr_opaquedata_set_unpacked (f, __null, data4, 4)",(char *)0x392,0x17e31f,
                   pcVar6);
  }
  pcVar6 = (char *)0xffffffff;
  iVar1 = (**(code **)(ctxt + 0x48))(ctxt,3,"Opaque data given invalid negative size (%d)");
  if (iVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar4,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n    expected: (",0x10);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
    pcVar4 = (char *)exr_get_default_error_message(3);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar4,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    core_test_fail("exr_attr_opaquedata_set_unpacked (f, &o, data4, -1)",(char *)0x395,0x17e31f,
                   pcVar6);
  }
  if ((local_98.unpacked_data != (void *)0x0) &&
     (local_98.destroy_unpacked_func_ptr != (_func_void_exr_context_t_void_ptr_int32_t *)0x0)) {
    (*local_98.destroy_unpacked_func_ptr)(ctxt,local_98.unpacked_data,local_98.unpacked_size);
  }
  local_98.unpacked_data = &local_9c;
  local_98.unpacked_size = 4;
  if (local_98.packed_data == (void *)0x0) {
LAB_001266ee:
    if (local_98.destroy_unpacked_func_ptr != (_func_void_exr_context_t_void_ptr_int32_t *)0x0) {
      (*local_98.destroy_unpacked_func_ptr)(ctxt,local_98.unpacked_data,local_98.unpacked_size);
    }
  }
  else {
    if (local_98.packed_alloc_size < 1) {
      local_98.packed_data = (void *)0x0;
      local_98.size = 0;
      local_98.unpacked_size = 4;
      local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
      goto LAB_001266ee;
    }
    (**(code **)(ctxt + 0x60))();
    local_98.packed_data = (void *)0x0;
    local_98.size = 0;
    local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
    if ((uint *)local_98.unpacked_data != (uint *)0x0) goto LAB_001266ee;
  }
  local_98.unpack_func_ptr =
       (_func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr_ptr *)0x0;
  local_98.pack_func_ptr =
       (_func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr *)0x0;
  local_98.packed_data = (void *)0x0;
  local_98.unpacked_data = (void *)0x0;
  local_98.size = 0;
  local_98.unpacked_size = 0;
  local_98.packed_alloc_size = 0;
  local_98.pad[0] = '\0';
  local_98.pad[1] = '\0';
  local_98.pad[2] = '\0';
  local_98.pad[3] = '\0';
  local_98.destroy_unpacked_func_ptr = (_func_void_exr_context_t_void_ptr_int32_t *)0x0;
  local_98.packed_data = (void *)(**(code **)(ctxt + 0x58))(4);
  if ((uint *)local_98.packed_data == (uint *)0x0) {
    iVar1 = (**(code **)(ctxt + 0x38))(ctxt,1);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
      pcVar4 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar4 == (char *)0x0) {
        std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      }
      else {
        sVar5 = strlen(pcVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar4,sVar5);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      core_test_fail("exr_attr_opaquedata_create (f, &o, 4, data4)",(char *)0x39b,0x17e31f,pcVar6);
    }
    if ((uint *)local_98.packed_data == (uint *)0x0) goto LAB_00126760;
  }
  else {
    local_98.size = 4;
    local_98.packed_alloc_size = 4;
  }
  pcVar6 = (char *)(ulong)local_9c;
  *(uint *)local_98.packed_data = local_9c;
LAB_00126760:
  if ((local_98.unpacked_data != (void *)0x0) &&
     (local_98.destroy_unpacked_func_ptr != (_func_void_exr_context_t_void_ptr_int32_t *)0x0)) {
    (*local_98.destroy_unpacked_func_ptr)(ctxt,local_98.unpacked_data,local_98.unpacked_size);
  }
  local_98.unpacked_data = &local_9c;
  local_98.unpacked_size = 4;
  if ((uint *)local_98.packed_data != (uint *)0x0) {
    if (0 < local_98.packed_alloc_size) {
      (**(code **)(ctxt + 0x60))();
    }
    local_98.packed_data = (uint *)0x0;
    local_98.size = 0;
    local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
  }
  eVar2 = exr_attr_opaquedata_copy(ctxt,&local_58,&local_98);
  if (eVar2 == 0) {
    if ((local_58.packed_data != (void *)0x0) && (0 < local_58.packed_alloc_size)) {
      (**(code **)(ctxt + 0x60))();
    }
    if ((local_58.unpacked_data != (void *)0x0) &&
       (local_58.destroy_unpacked_func_ptr != (_func_void_exr_context_t_void_ptr_int32_t *)0x0)) {
      (*local_58.destroy_unpacked_func_ptr)(ctxt,local_58.unpacked_data,local_58.unpacked_size);
    }
    local_58.unpack_func_ptr =
         (_func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr_ptr *)0x0;
    local_58.pack_func_ptr =
         (_func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr *)0x0;
    local_58.packed_data = (void *)0x0;
    local_58.unpacked_data = (void *)0x0;
    local_58.size = 0;
    local_58.unpacked_size = 0;
    local_58.packed_alloc_size = 0;
    local_58.pad[0] = '\0';
    local_58.pad[1] = '\0';
    local_58.pad[2] = '\0';
    local_58.pad[3] = '\0';
    local_58.destroy_unpacked_func_ptr = (_func_void_exr_context_t_void_ptr_int32_t *)0x0;
    if (((uint *)local_98.packed_data != (uint *)0x0) && (0 < local_98.packed_alloc_size)) {
      (**(code **)(ctxt + 0x60))();
    }
    if (((uint *)local_98.unpacked_data != (uint *)0x0) &&
       (local_98.destroy_unpacked_func_ptr != (_func_void_exr_context_t_void_ptr_int32_t *)0x0)) {
      (*local_98.destroy_unpacked_func_ptr)(ctxt,local_98.unpacked_data,local_98.unpacked_size);
    }
    exr_finish(&local_20);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
  pcVar4 = (char *)exr_get_default_error_message(eVar2);
  if (pcVar4 == (char *)0x0) {
    std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
  }
  else {
    sVar5 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar4,sVar5);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  core_test_fail("exr_attr_opaquedata_copy (f, &o2, &o)",(char *)0x39d,0x17e31f,pcVar6);
}

Assistant:

void
testAttrOpaque (const std::string& tempdir)
{
    // we no longer allow a null context as we need the memory allocator
    //testOpaqueHelper (NULL);
    exr_context_t f = createDummyFile ("<opaque>");
    testOpaqueHelper (f);
    exr_finish (&f);
}